

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O0

void __thiscall dlib::logger::logger(logger *this,string *name_)

{
  undefined1 uVar1;
  global_data *pgVar2;
  streambuf *psVar3;
  print_header_type p_Var4;
  string *in_RSI;
  undefined8 *in_RDI;
  logger *temp;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  string *in_stack_ffffffffffffff78;
  global_data *in_stack_ffffffffffffff80;
  global_data *in_stack_ffffffffffffff88;
  
  *in_RDI = &PTR__logger_005560d0;
  pgVar2 = get_global_data();
  in_RDI[1] = pgVar2;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  psVar3 = global_data::output_streambuf(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::ostream::ostream(in_RDI + 8,psVar3);
  global_data::level(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
  ::member_function_pointer
            ((member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
              *)0x3d91a1);
  auto_mutex::auto_mutex
            ((auto_mutex *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  ::add((set_kernel_1<dlib::logger_*,_dlib::binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
         *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
        (logger **)in_stack_ffffffffffffff38);
  p_Var4 = global_data::logger_header(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  in_RDI[6] = p_Var4;
  uVar1 = global_data::auto_flush(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(undefined1 *)(in_RDI + 7) = uVar1;
  global_data::output_hook(in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80);
  member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
  ::operator=((member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
               *)CONCAT17(uVar1,in_stack_ffffffffffffff40),
              (member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
               *)in_stack_ffffffffffffff38);
  member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
  ::~member_function_pointer
            ((member_function_pointer<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_dlib::log_level_&,_const_unsigned_long_long,_const_char_*>
              *)0x3d925d);
  auto_mutex::~auto_mutex((auto_mutex *)0x3d926a);
  return;
}

Assistant:

logger::
    logger (  
        const std::string& name_
    ) : 
        gd(get_global_data()),
        logger_name(name_),
        out(gd.output_streambuf(logger_name)),
        cur_level(gd.level(logger_name))
    {
        DLIB_ASSERT(name_[0] != '\0',
                    "\tlogger::logger()"
                    << "\n\tYou can't make a logger with an empty name"
                    << "\n\tthis: " << this
        );

        auto_mutex M(gd.m);
        logger* temp = this;
        gd.loggers.add(temp);

        // load the appropriate settings
        print_header        = gd.logger_header(logger_name);
        auto_flush_enabled  = gd.auto_flush(logger_name);
        hook                = gd.output_hook(logger_name);
    }